

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCobraConnection.cpp
# Opt level: O2

bool __thiscall ix::CobraConnection::handleHandshakeResponse(CobraConnection *this,Value *pdu)

{
  bool bVar1;
  Value *pVVar2;
  Value nonce;
  Value data;
  Value body;
  string sStack_a8;
  Value local_88;
  Value local_60;
  Value local_38;
  
  bVar1 = Json::Value::isMember(pdu,"body");
  if (bVar1) {
    pVVar2 = Json::Value::operator[](pdu,"body");
    Json::Value::Value(&local_38,pVVar2);
    bVar1 = Json::Value::isMember(&local_38,"data");
    if (bVar1) {
      pVVar2 = Json::Value::operator[](&local_38,"data");
      Json::Value::Value(&local_60,pVVar2);
      bVar1 = Json::Value::isMember(&local_60,"nonce");
      if (bVar1) {
        pVVar2 = Json::Value::operator[](&local_60,"nonce");
        Json::Value::Value(&local_88,pVVar2);
        bVar1 = Json::Value::isString(&local_88);
        if (bVar1) {
          Json::Value::asString_abi_cxx11_(&sStack_a8,&local_88);
          bVar1 = sendAuthMessage(this,&sStack_a8);
          ::std::__cxx11::string::~string((string *)&sStack_a8);
        }
        else {
          bVar1 = false;
        }
        Json::Value::~Value(&local_88);
      }
      else {
        bVar1 = false;
      }
      Json::Value::~Value(&local_60);
    }
    else {
      bVar1 = false;
    }
    Json::Value::~Value(&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CobraConnection::handleHandshakeResponse(const Json::Value& pdu)
    {
        if (!pdu.isMember("body")) return false;
        Json::Value body = pdu["body"];

        if (!body.isMember("data")) return false;
        Json::Value data = body["data"];

        if (!data.isMember("nonce")) return false;
        Json::Value nonce = data["nonce"];

        if (!nonce.isString()) return false;

        return sendAuthMessage(nonce.asString());
    }